

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O2

void __thiscall
Assimp::FindInvalidDataProcess::Execute(FindInvalidDataProcess *this,aiScene *pScene)

{
  aiMesh *this_00;
  int iVar1;
  uint uVar2;
  Logger *pLVar3;
  DeadlyImportError *this_01;
  uint a;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  allocator<char> local_69;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshMapping;
  string local_50;
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"FindInvalidDataProcess begin");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&meshMapping,(ulong)pScene->mNumMeshes,(allocator_type *)&local_50);
  uVar4 = 0;
  uVar5 = 0;
  bVar6 = false;
  do {
    uVar2 = (uint)uVar5;
    if (pScene->mNumMeshes <= uVar4) {
      for (uVar5 = 0; uVar5 < pScene->mNumAnimations; uVar5 = uVar5 + 1) {
        ProcessAnimation(this,pScene->mAnimations[uVar5]);
      }
      if (bVar6) {
        if (uVar2 != pScene->mNumMeshes) {
          if (uVar2 == 0) {
            this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"No meshes remaining",&local_69);
            DeadlyImportError::DeadlyImportError(this_01,&local_50);
            __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          UpdateMeshReferences(pScene->mRootNode,&meshMapping);
          pScene->mNumMeshes = uVar2;
        }
        pLVar3 = DefaultLogger::get();
        Logger::info(pLVar3,"FindInvalidDataProcess finished. Found issues ...");
      }
      else {
        pLVar3 = DefaultLogger::get();
        Logger::debug(pLVar3,"FindInvalidDataProcess finished. Everything seems to be OK.");
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&meshMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return;
    }
    iVar1 = ProcessMesh(this,pScene->mMeshes[uVar4]);
    if (iVar1 == 0) {
LAB_003b4d7e:
      pScene->mMeshes[uVar5] = pScene->mMeshes[uVar4];
      uVar5 = (ulong)(uVar2 + 1);
    }
    else {
      if (iVar1 != 2) {
        bVar6 = true;
        goto LAB_003b4d7e;
      }
      this_00 = pScene->mMeshes[uVar4];
      if (this_00 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(this_00);
      }
      operator_delete(this_00,0x520);
      pScene->mMeshes[uVar4] = (aiMesh *)0x0;
      bVar6 = true;
      uVar2 = 0xffffffff;
    }
    meshMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] = uVar2;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void FindInvalidDataProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("FindInvalidDataProcess begin");

    bool out = false;
    std::vector<unsigned int> meshMapping(pScene->mNumMeshes);
    unsigned int real = 0;

    // Process meshes
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)   {

        int result;
        if ((result = ProcessMesh( pScene->mMeshes[a])))    {
            out = true;

            if (2 == result)    {
                // remove this mesh
                delete pScene->mMeshes[a];
                AI_DEBUG_INVALIDATE_PTR(pScene->mMeshes[a]);

                meshMapping[a] = UINT_MAX;
                continue;
            }
        }
        pScene->mMeshes[real] = pScene->mMeshes[a];
        meshMapping[a] = real++;
    }

    // Process animations
    for (unsigned int a = 0; a < pScene->mNumAnimations;++a) {
        ProcessAnimation( pScene->mAnimations[a]);
    }


    if (out)    {
        if ( real != pScene->mNumMeshes)    {
            if (!real) {
                throw DeadlyImportError("No meshes remaining");
            }

            // we need to remove some meshes.
            // therefore we'll also need to remove all references
            // to them from the scenegraph
            UpdateMeshReferences(pScene->mRootNode,meshMapping);
            pScene->mNumMeshes = real;
        }

        ASSIMP_LOG_INFO("FindInvalidDataProcess finished. Found issues ...");
    } else {
        ASSIMP_LOG_DEBUG("FindInvalidDataProcess finished. Everything seems to be OK.");
    }
}